

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O0

void la_miam_xoff_ind_format_json(la_vstring *vstr,void *data)

{
  la_vstring *in_RSI;
  la_miam_xoff_ind_msg *msg;
  la_vstring *vstr_00;
  
  vstr_00 = in_RSI;
  la_json_append_bool(in_RSI,(char *)in_RSI,false);
  if (*(short *)&in_RSI->str != 0xfff) {
    la_json_append_int64(vstr_00,(char *)in_RSI,0x17d3eb);
  }
  return;
}

Assistant:

static void la_miam_xoff_ind_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_miam_xoff_ind_msg const *msg = data;
	la_json_append_bool(vstr, "all_files", msg->file_id == 0xFFF);
	if(msg->file_id != 0xFFF) {
		la_json_append_int64(vstr, "file_id", msg->file_id);
	}
}